

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O2

void match(lzma_coder_conflict9 *coder,uint32_t pos_state,uint32_t distance,uint32_t len)

{
  uint32_t bit_count;
  uint uVar1;
  uint symbol;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  
  coder->state = (uint)(STATE_SHORTREP_LIT < coder->state) * 3 + STATE_LIT_MATCH;
  length(&coder->rc,&coder->match_len_encoder,pos_state,len,coder->fast_mode);
  if (distance < 0x2000) {
    uVar1 = (uint)""[distance];
  }
  else if (distance < 0x2000000) {
    uVar1 = ""[distance >> 0xc] + 0x18;
  }
  else {
    uVar1 = ""[distance >> 0x18] + 0x30;
  }
  uVar2 = 3;
  if (len < 6) {
    uVar2 = (ulong)(len - 2);
  }
  rc_bittree(&coder->rc,coder->pos_slot[uVar2],6,uVar1);
  if (3 < uVar1) {
    bit_count = (uVar1 >> 1) - 1;
    uVar3 = (uVar1 & 1 | 2) << ((byte)bit_count & 0x1f);
    symbol = distance - uVar3;
    if (uVar1 < 0xe) {
      rc_bittree_reverse(&coder->rc,
                         (probability *)
                         ((long)coder + ((ulong)uVar3 * 2 - (ulong)(uVar1 * 2)) + 0x70fa),bit_count,
                         symbol);
    }
    else {
      sVar4 = (coder->rc).count;
      uVar1 = (uVar1 >> 1) - 6;
      do {
        (coder->rc).symbols[sVar4] = (((symbol >> 4) >> (uVar1 & 0x1f) & 1) != 0) + RC_DIRECT_0;
        sVar4 = sVar4 + 1;
        bVar5 = uVar1 != 0;
        uVar1 = uVar1 - 1;
      } while (bVar5);
      (coder->rc).count = sVar4;
      rc_bittree_reverse(&coder->rc,coder->pos_align,4,symbol & 0xf);
      coder->align_price_count = coder->align_price_count + 1;
    }
  }
  coder->reps[3] = coder->reps[2];
  *(undefined8 *)(coder->reps + 1) = *(undefined8 *)coder->reps;
  coder->reps[0] = distance;
  coder->match_price_count = coder->match_price_count + 1;
  return;
}

Assistant:

static inline void
match(lzma_coder *coder, const uint32_t pos_state,
		const uint32_t distance, const uint32_t len)
{
	uint32_t pos_slot;
	uint32_t len_to_pos_state;

	update_match(coder->state);

	length(&coder->rc, &coder->match_len_encoder, pos_state, len,
			coder->fast_mode);

	pos_slot = get_pos_slot(distance);
	len_to_pos_state = get_len_to_pos_state(len);
	rc_bittree(&coder->rc, coder->pos_slot[len_to_pos_state],
			POS_SLOT_BITS, pos_slot);

	if (pos_slot >= START_POS_MODEL_INDEX) {
		const uint32_t footer_bits = (pos_slot >> 1) - 1;
		const uint32_t base = (2 | (pos_slot & 1)) << footer_bits;
		const uint32_t pos_reduced = distance - base;

		if (pos_slot < END_POS_MODEL_INDEX) {
			// Careful here: base - pos_slot - 1 can be -1, but
			// rc_bittree_reverse starts at probs[1], not probs[0].
			rc_bittree_reverse(&coder->rc,
				coder->pos_special + base - pos_slot - 1,
				footer_bits, pos_reduced);
		} else {
			rc_direct(&coder->rc, pos_reduced >> ALIGN_BITS,
					footer_bits - ALIGN_BITS);
			rc_bittree_reverse(
					&coder->rc, coder->pos_align,
					ALIGN_BITS, pos_reduced & ALIGN_MASK);
			++coder->align_price_count;
		}
	}

	coder->reps[3] = coder->reps[2];
	coder->reps[2] = coder->reps[1];
	coder->reps[1] = coder->reps[0];
	coder->reps[0] = distance;
	++coder->match_price_count;
}